

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

void checkudata(global_State *g,Udata *u)

{
  Table *t;
  int iVar1;
  Udata *iu;
  TValue *io;
  Table *mt;
  TValue uservalue;
  GCObject *hgc;
  Udata *u_local;
  global_State *g_local;
  
  if (9 < (u->tt & 0xf)) {
    __assert_fail("(((u)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x111,"void checkudata(global_State *, Udata *)");
  }
  t = u->metatable;
  uservalue._8_8_ = u;
  if (t != (Table *)0x0) {
    if (9 < (t->tt & 0xf)) {
      __assert_fail("(((mt)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x114,"void checkudata(global_State *, Udata *)");
    }
    iVar1 = testobjref(g,(GCObject *)u,(GCObject *)t);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x114,"void checkudata(global_State *, Udata *)");
    }
  }
  mt = (Table *)(u->user_).gc;
  uservalue.value_.b._0_2_ = u->ttuv_;
  if ((uservalue.value_.b._0_2_ & 0x8000) != 0) {
    if ((uservalue.value_.b._0_2_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x115,"void checkudata(global_State *, Udata *)");
    }
    if ((uservalue.value_.b._0_2_ & 0x7f) != (ushort)mt->tt) {
LAB_001642f9:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x115,"void checkudata(global_State *, Udata *)");
    }
    if (g->mainthread != (lua_State *)0x0) {
      if ((uservalue.value_.b._0_2_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x115,"void checkudata(global_State *, Udata *)");
      }
      if ((mt->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0) goto LAB_001642f9;
    }
  }
  checkvalref(g,(GCObject *)uservalue._8_8_,(TValue *)&mt);
  return;
}

Assistant:

static void checkudata (global_State *g, Udata *u) {
  GCObject *hgc = obj2gco(u);
  TValue uservalue;
  Table *mt = u->metatable;
  checkobjref(g, hgc, mt);
  getuservalue(g->mainthread, u, &uservalue);
  checkvalref(g, hgc, &uservalue);
}